

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

int __thiscall QPDF::lengthNextN(QPDF *this,int first_object,int n)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  uint __val;
  QPDFObjGen og_00;
  uint uVar2;
  int iVar3;
  uint uVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  qpdf_offset_t qVar8;
  long *plVar9;
  ulong uVar10;
  long *plVar11;
  size_type *psVar12;
  uint __len;
  long lVar13;
  undefined4 in_register_00000034;
  uint uVar14;
  int iVar15;
  string_view msg;
  QPDFObjGen og;
  string __str;
  key_type local_b0;
  string local_a8;
  int local_84;
  QPDF *local_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58 [2];
  long local_48 [2];
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,first_object);
  if (n < 1) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    iVar15 = 0;
    local_84 = n;
    local_80 = this;
    do {
      uVar14 = (int)local_38 + iVar15;
      local_b0.gen = 0;
      _Var1._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      local_b0.obj = uVar14;
      cVar5 = std::
              _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
              ::find(&((_Var1._M_head_impl)->xref_table)._M_t,&local_b0);
      if (cVar5._M_node == (_Base_ptr)((long)&(_Var1._M_head_impl)->xref_table + 8U)) {
        __val = -uVar14;
        if (0 < (int)uVar14) {
          __val = uVar14;
        }
        __len = 1;
        if (9 < __val) {
          uVar10 = (ulong)__val;
          uVar2 = 4;
          do {
            __len = uVar2;
            uVar4 = (uint)uVar10;
            if (uVar4 < 100) {
              __len = __len - 2;
              goto LAB_00219296;
            }
            if (uVar4 < 1000) {
              __len = __len - 1;
              goto LAB_00219296;
            }
            if (uVar4 < 10000) goto LAB_00219296;
            uVar10 = uVar10 / 10000;
            uVar2 = __len + 4;
          } while (99999 < uVar4);
          __len = __len + 1;
        }
LAB_00219296:
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct
                  ((ulong)local_58,(char)__len - (char)((int)uVar14 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar14 >> 0x1f) + (long)local_58[0]),__len,__val);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x27db19);
        this = local_80;
        plVar11 = plVar9 + 2;
        if ((long *)*plVar9 == plVar11) {
          local_68 = *plVar11;
          lStack_60 = plVar9[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *plVar11;
          local_78 = (long *)*plVar9;
        }
        local_70 = plVar9[1];
        *plVar9 = (long)plVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_78);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_a8.field_2._M_allocated_capacity = *psVar12;
          local_a8.field_2._8_8_ = plVar9[3];
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        }
        else {
          local_a8.field_2._M_allocated_capacity = *psVar12;
          local_a8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_a8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        msg._M_str = local_a8._M_dataplus._M_p;
        msg._M_len = local_a8._M_string_length;
        linearizationWarning(this,msg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
      }
      else {
        _Var1._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        cVar6 = std::
                _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDF::ObjCache>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                ::find(&((_Var1._M_head_impl)->obj_cache)._M_t,&local_b0);
        if (cVar6._M_node == (_Base_ptr)((long)&(_Var1._M_head_impl)->obj_cache + 8U)) {
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,
                     "found unknown object while calculating length for linearization data","");
          stopOnError(this,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
        }
        pmVar7 = std::
                 map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                 ::operator[](&((this->m)._M_t.
                                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                               obj_cache,&local_b0);
        lVar13 = pmVar7->end_after_space;
        og_00.gen = local_b0.gen;
        og_00.obj = local_b0.obj;
        qVar8 = getLinearizationOffset(this,og_00);
        lVar13 = lVar13 - qVar8;
        if ((int)lVar13 != lVar13) {
          QIntC::IntConverter<long_long,_int,_true,_true>::error(lVar13);
        }
        iVar3 = iVar3 + (int)lVar13;
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 != local_84);
  }
  return iVar3;
}

Assistant:

int
QPDF::lengthNextN(int first_object, int n)
{
    int length = 0;
    for (int i = 0; i < n; ++i) {
        QPDFObjGen og(first_object + i, 0);
        if (m->xref_table.count(og) == 0) {
            linearizationWarning(
                "no xref table entry for " + std::to_string(first_object + i) + " 0");
        } else {
            if (m->obj_cache.count(og) == 0) {
                stopOnError("found unknown object while calculating length for linearization data");
            }
            length += toI(m->obj_cache[og].end_after_space - getLinearizationOffset(og));
        }
    }
    return length;
}